

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall skiwi::anon_unknown_23::macros::test(macros *this)

{
  allocator<char> local_6d9;
  string local_6d8;
  string local_6b8;
  allocator<char> local_691;
  string local_690;
  string local_670;
  allocator<char> local_649;
  string local_648;
  string local_628;
  allocator<char> local_601;
  string local_600;
  string local_5e0;
  allocator<char> local_5b9;
  string local_5b8;
  string local_598;
  allocator<char> local_571;
  string local_570;
  string local_550;
  allocator<char> local_529;
  string local_528;
  string local_508;
  allocator<char> local_4e1;
  string local_4e0;
  string local_4c0;
  allocator<char> local_499;
  string local_498;
  string local_478;
  allocator<char> local_451;
  string local_450;
  string local_430;
  allocator<char> local_409;
  string local_408;
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  string local_358;
  allocator<char> local_331;
  string local_330;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  string local_280;
  allocator<char> local_259;
  string local_258;
  string local_238;
  allocator<char> local_211;
  string local_210;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  string local_160;
  allocator<char> local_139;
  string local_138;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  string local_88;
  allocator<char> local_51;
  string local_50;
  string local_30;
  macros *local_10;
  macros *this_local;
  
  local_10 = this;
  compile_fixture_skiwi::build_srfi6((compile_fixture_skiwi *)this);
  compile_fixture_skiwi::build_srfi28((compile_fixture_skiwi *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"(define-macro (eight) \'(+ 3 5))  (eight)",&local_51);
  compile_fixture_skiwi::run(&local_30,(compile_fixture_skiwi *)this,&local_50);
  TestEq<char_const*,std::__cxx11::string>
            ("8",&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x13ea,"void skiwi::(anonymous namespace)::macros::test()");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"(define-macro (sum x y) `(+ ,x ,y))  (sum 3 4)",&local_a9);
  compile_fixture_skiwi::run(&local_88,(compile_fixture_skiwi *)this,&local_a8);
  TestEq<char_const*,std::__cxx11::string>
            ("7",&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x13eb,"void skiwi::(anonymous namespace)::macros::test()");
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"(sum (+ 4 5) (- 4 3))",&local_f1);
  compile_fixture_skiwi::run(&local_d0,(compile_fixture_skiwi *)this,&local_f0);
  TestEq<char_const*,std::__cxx11::string>
            ("10",&local_d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x13ec,"void skiwi::(anonymous namespace)::macros::test()");
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,
             "(define-macro (when2 test . args) `(if ,test (begin ,@args) #f))  (when2 (> 5 2) 7 8 9 10)"
             ,&local_139);
  compile_fixture_skiwi::run(&local_118,(compile_fixture_skiwi *)this,&local_138);
  TestEq<char_const*,std::__cxx11::string>
            ("10",&local_118,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x13ed,"void skiwi::(anonymous namespace)::macros::test()");
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"(when2 (< 5 2) 7 8 9 10)",&local_181);
  compile_fixture_skiwi::run(&local_160,(compile_fixture_skiwi *)this,&local_180);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_160,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x13ee,"void skiwi::(anonymous namespace)::macros::test()");
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"(define x 2) (define y 1) (when2 (< y x) 7 8 9 10)",&local_1c9);
  compile_fixture_skiwi::run(&local_1a8,(compile_fixture_skiwi *)this,&local_1c8);
  TestEq<char_const*,std::__cxx11::string>
            ("10",&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x13ef,"void skiwi::(anonymous namespace)::macros::test()");
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,
             "(define-macro (sandwich TOPPING FILLING please) `(format \"I love ~a with ~a.\" \',FILLING \',TOPPING)) (sandwich brie ham now)"
             ,&local_211);
  compile_fixture_skiwi::run(&local_1f0,(compile_fixture_skiwi *)this,&local_210);
  TestEq<char_const*,std::__cxx11::string>
            ("\"I love ham with brie.\"",&local_1f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x13f0,"void skiwi::(anonymous namespace)::macros::test()");
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"(sandwich banana bacon please)",&local_259);
  compile_fixture_skiwi::run(&local_238,(compile_fixture_skiwi *)this,&local_258);
  TestEq<char_const*,std::__cxx11::string>
            ("\"I love bacon with banana.\"",&local_238,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x13f1,"void skiwi::(anonymous namespace)::macros::test()");
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,
             "(define-macro (sub5 x) `(begin (define-macro (subtract a b) `(- ,a ,b)) (subtract ,x 5) ) )  (sub5 100)"
             ,&local_2a1);
  compile_fixture_skiwi::run(&local_280,(compile_fixture_skiwi *)this,&local_2a0);
  TestEq<char_const*,std::__cxx11::string>
            ("95",&local_280,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x13f3,"void skiwi::(anonymous namespace)::macros::test()");
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  compile_fixture_skiwi::build_mbe((compile_fixture_skiwi *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,
             "(define-syntax and2 (syntax-rules() ((and2) #t) ((and2 test) test) ((and2 test1 test2 ...) (if test1(and2 test2 ...) #f))))"
             ,&local_2e9);
  compile_fixture_skiwi::run(&local_2c8,(compile_fixture_skiwi *)this,&local_2e8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,"(and2 #t #t #t #t)",&local_331);
  compile_fixture_skiwi::run(&local_310,(compile_fixture_skiwi *)this,&local_330);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_310,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x13f7,"void skiwi::(anonymous namespace)::macros::test()");
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator(&local_331);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"(and2 #f #t #t #t)",&local_379);
  compile_fixture_skiwi::run(&local_358,(compile_fixture_skiwi *)this,&local_378);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_358,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x13f8,"void skiwi::(anonymous namespace)::macros::test()");
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c0,"(and2 #t #f #t #t)",&local_3c1);
  compile_fixture_skiwi::run(&local_3a0,(compile_fixture_skiwi *)this,&local_3c0);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_3a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x13f9,"void skiwi::(anonymous namespace)::macros::test()");
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_408,"(and2 #t #f #t #f)",&local_409);
  compile_fixture_skiwi::run(&local_3e8,(compile_fixture_skiwi *)this,&local_408);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_3e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x13fa,"void skiwi::(anonymous namespace)::macros::test()");
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator(&local_409);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_450,"(and2 #t #t #t #f)",&local_451);
  compile_fixture_skiwi::run(&local_430,(compile_fixture_skiwi *)this,&local_450);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_430,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x13fb,"void skiwi::(anonymous namespace)::macros::test()");
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator(&local_451);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_498,
             "(define-syntax or2 (syntax-rules() ((or2) #f) ((or2 test) test) ((or2 test1 test2 ...) (let ((t test1)) (if t t (or2 test2 ...)))  )))"
             ,&local_499);
  compile_fixture_skiwi::run(&local_478,(compile_fixture_skiwi *)this,&local_498);
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator(&local_499);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4e0,"(or2 #t #t #t #t)",&local_4e1);
  compile_fixture_skiwi::run(&local_4c0,(compile_fixture_skiwi *)this,&local_4e0);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_4c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x13fe,"void skiwi::(anonymous namespace)::macros::test()");
  std::__cxx11::string::~string((string *)&local_4c0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator(&local_4e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_528,"(or2 #f #t #t #t)",&local_529);
  compile_fixture_skiwi::run(&local_508,(compile_fixture_skiwi *)this,&local_528);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_508,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x13ff,"void skiwi::(anonymous namespace)::macros::test()");
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator(&local_529);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_570,"(or2 #t #f #t #t)",&local_571);
  compile_fixture_skiwi::run(&local_550,(compile_fixture_skiwi *)this,&local_570);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_550,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x1400,"void skiwi::(anonymous namespace)::macros::test()");
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator(&local_571);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b8,"(or2 #t #f #t #f)",&local_5b9);
  compile_fixture_skiwi::run(&local_598,(compile_fixture_skiwi *)this,&local_5b8);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_598,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x1401,"void skiwi::(anonymous namespace)::macros::test()");
  std::__cxx11::string::~string((string *)&local_598);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator(&local_5b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_600,"(or2 #t #t #t #f)",&local_601);
  compile_fixture_skiwi::run(&local_5e0,(compile_fixture_skiwi *)this,&local_600);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_5e0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x1402,"void skiwi::(anonymous namespace)::macros::test()");
  std::__cxx11::string::~string((string *)&local_5e0);
  std::__cxx11::string::~string((string *)&local_600);
  std::allocator<char>::~allocator(&local_601);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_648,"(or2 #f #f #f #f)",&local_649);
  compile_fixture_skiwi::run(&local_628,(compile_fixture_skiwi *)this,&local_648);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_628,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x1403,"void skiwi::(anonymous namespace)::macros::test()");
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::~string((string *)&local_648);
  std::allocator<char>::~allocator(&local_649);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_690,"(defmacro mac1 (a b) `(+ ,a (* ,b 3))) (mac1 4 5)",&local_691);
  compile_fixture_skiwi::run(&local_670,(compile_fixture_skiwi *)this,&local_690);
  TestEq<char_const*,std::__cxx11::string>
            ("19",&local_670,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x1405,"void skiwi::(anonymous namespace)::macros::test()");
  std::__cxx11::string::~string((string *)&local_670);
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator(&local_691);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6d8,"(defmacro eight2 () `8) (eight2)",&local_6d9);
  compile_fixture_skiwi::run(&local_6b8,(compile_fixture_skiwi *)this,&local_6d8);
  TestEq<char_const*,std::__cxx11::string>
            ("8",&local_6b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x1406,"void skiwi::(anonymous namespace)::macros::test()");
  std::__cxx11::string::~string((string *)&local_6b8);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::allocator<char>::~allocator(&local_6d9);
  return;
}

Assistant:

void test()
      {
      build_srfi6();
      build_srfi28();
      TEST_EQ("8", run("(define-macro (eight) '(+ 3 5))  (eight)"));
      TEST_EQ("7", run("(define-macro (sum x y) `(+ ,x ,y))  (sum 3 4)"));
      TEST_EQ("10", run("(sum (+ 4 5) (- 4 3))"));
      TEST_EQ("10", run("(define-macro (when2 test . args) `(if ,test (begin ,@args) #f))  (when2 (> 5 2) 7 8 9 10)"));
      TEST_EQ("#f", run("(when2 (< 5 2) 7 8 9 10)"));
      TEST_EQ("10", run("(define x 2) (define y 1) (when2 (< y x) 7 8 9 10)"));
      TEST_EQ("\"I love ham with brie.\"", run("(define-macro (sandwich TOPPING FILLING please) `(format \"I love ~a with ~a.\" ',FILLING ',TOPPING)) (sandwich brie ham now)"));
      TEST_EQ("\"I love bacon with banana.\"", run("(sandwich banana bacon please)"));
      //TEST_EQ("error:1:2: No matching case for calling pattern in macro: sandwich", run("(sandwich brie ham)")); TOCHECK
      TEST_EQ("95", run("(define-macro (sub5 x) `(begin (define-macro (subtract a b) `(- ,a ,b)) (subtract ,x 5) ) )  (sub5 100)"));

      build_mbe();
      run("(define-syntax and2 (syntax-rules() ((and2) #t) ((and2 test) test) ((and2 test1 test2 ...) (if test1(and2 test2 ...) #f))))");
      TEST_EQ("#t", run("(and2 #t #t #t #t)"));
      TEST_EQ("#f", run("(and2 #f #t #t #t)"));
      TEST_EQ("#f", run("(and2 #t #f #t #t)"));
      TEST_EQ("#f", run("(and2 #t #f #t #f)"));
      TEST_EQ("#f", run("(and2 #t #t #t #f)"));

      run("(define-syntax or2 (syntax-rules() ((or2) #f) ((or2 test) test) ((or2 test1 test2 ...) (let ((t test1)) (if t t (or2 test2 ...)))  )))");
      TEST_EQ("#t", run("(or2 #t #t #t #t)"));
      TEST_EQ("#t", run("(or2 #f #t #t #t)"));
      TEST_EQ("#t", run("(or2 #t #f #t #t)"));
      TEST_EQ("#t", run("(or2 #t #f #t #f)"));
      TEST_EQ("#t", run("(or2 #t #t #t #f)"));
      TEST_EQ("#f", run("(or2 #f #f #f #f)"));

      TEST_EQ("19", run("(defmacro mac1 (a b) `(+ ,a (* ,b 3))) (mac1 4 5)"));
      TEST_EQ("8", run("(defmacro eight2 () `8) (eight2)"));
      }